

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  bool bVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  pointer pbVar5;
  undefined8 uVar6;
  size_t sVar7;
  size_type sVar8;
  pointer pbVar9;
  size_type sVar10;
  ulong uVar11;
  SelectorEqual *in_RCX;
  ulong uVar12;
  short __tmp_1;
  SelectorHash *in_RDX;
  ushort uVar13;
  bucket_entry *pbVar14;
  allocator<objc_selector_*> *in_R8;
  objc_selector *__tmp;
  bucket_entry<objc_selector_*,_true> *bucket;
  pointer pbVar15;
  unsigned_long __tmp_3;
  power_of_two_growth_policy<2UL> __tmp_2;
  robin_hash<objc_selector_*,_tsl::robin_set<objc_selector_*,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_(anonymous_namespace)::SelectorHash,_(anonymous_namespace)::SelectorEqual,_std::allocator<objc_selector_*>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  local_80;
  
  robin_hash(&local_80,count_,in_RDX,in_RCX,in_R8,this->m_min_load_factor,this->m_max_load_factor);
  pbVar15 = (this->m_buckets_data).
            super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_0011c34b:
  if (pbVar15 == pbVar5) {
    sVar7 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
    (this->super_power_of_two_growth_policy<2UL>).m_mask =
         local_80.super_power_of_two_growth_policy<2UL>.m_mask;
    pbVar15 = (this->m_buckets_data).
              super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar5 = (this->m_buckets_data).
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_buckets_data).
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_80.m_buckets_data.
         super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_buckets_data).
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_80.m_buckets_data.
         super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    pbVar9 = (this->m_buckets_data).
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar14 = this->m_buckets;
    (this->m_buckets_data).
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_80.m_buckets_data.
         super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    this->m_buckets = local_80.m_buckets;
    sVar10 = this->m_bucket_count;
    local_80.m_nb_elements = this->m_nb_elements;
    this->m_bucket_count = local_80.m_bucket_count;
    sVar8 = this->m_load_threshold;
    this->m_load_threshold = local_80.m_load_threshold;
    uVar6._0_4_ = this->m_min_load_factor;
    uVar6._4_4_ = this->m_max_load_factor;
    this->m_min_load_factor = local_80.m_min_load_factor;
    this->m_max_load_factor = local_80.m_max_load_factor;
    bVar1 = this->m_grow_on_next_insert;
    this->m_grow_on_next_insert = local_80.m_grow_on_next_insert;
    bVar2 = this->m_try_shrink_on_next_insert;
    this->m_try_shrink_on_next_insert = local_80.m_try_shrink_on_next_insert;
    local_80.super_power_of_two_growth_policy<2UL>.m_mask = sVar7;
    local_80.m_buckets_data.
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar15;
    local_80.m_buckets_data.
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
    local_80.m_buckets_data.
    super__Vector_base<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
    local_80.m_buckets = pbVar14;
    local_80.m_bucket_count = sVar10;
    local_80.m_load_threshold = sVar8;
    local_80._64_8_ = uVar6;
    local_80.m_grow_on_next_insert = bVar1;
    local_80.m_try_shrink_on_next_insert = bVar2;
    std::
    vector<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>,_std::allocator<tsl::detail_robin_hash::bucket_entry<objc_selector_*,_true>_>_>
    ::~vector(&local_80.m_buckets_data);
    return;
  }
  if (pbVar15->m_dist_from_ideal_bucket != -1) {
    if (local_80.m_bucket_count < 0x100000001) {
      uVar11 = (ulong)(pbVar15->super_bucket_entry_hash<true>).m_hash;
    }
    else {
      uVar11 = robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::hash_key<objc_selector*>
                         ((robin_hash<objc_selector*,tsl::robin_set<objc_selector*,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,(anonymous_namespace)::SelectorHash,(anonymous_namespace)::SelectorEqual,std::allocator<objc_selector*>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)pbVar15->m_value,(objc_selector **)count_);
    }
    uVar13 = 0;
    uVar12 = uVar11;
    do {
      uVar12 = uVar12 & local_80.super_power_of_two_growth_policy<2UL>.m_mask;
      uVar3 = local_80.m_buckets[uVar12].m_dist_from_ideal_bucket;
      count_ = (size_type)uVar3;
      if ((short)uVar3 < (short)uVar13) {
        pbVar14 = local_80.m_buckets + uVar12;
        uVar6 = *(undefined8 *)pbVar15->m_value;
        if (uVar3 == 0xffff) goto LAB_0011c3c3;
        *(undefined8 *)pbVar15->m_value = *(undefined8 *)pbVar14->m_value;
        *(undefined8 *)pbVar14->m_value = uVar6;
        pbVar14->m_dist_from_ideal_bucket = uVar13;
        uVar4 = (pbVar14->super_bucket_entry_hash<true>).m_hash;
        (pbVar14->super_bucket_entry_hash<true>).m_hash = (truncated_hash_type)uVar11;
        uVar11 = (ulong)uVar4;
        uVar13 = uVar3;
      }
      uVar13 = uVar13 + 1;
      uVar12 = uVar12 + 1;
    } while( true );
  }
  goto LAB_0011c3cd;
LAB_0011c3c3:
  *(undefined8 *)pbVar14->m_value = uVar6;
  (pbVar14->super_bucket_entry_hash<true>).m_hash = (truncated_hash_type)uVar11;
  pbVar14->m_dist_from_ideal_bucket = uVar13;
LAB_0011c3cd:
  pbVar15 = pbVar15 + 1;
  goto LAB_0011c34b;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }